

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int prolog2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  
  switch(tok - 0xbU >> 1 | (uint)((tok - 0xbU & 1) != 0) << 0x1f) {
  case 0:
    iVar1 = 0x37;
    break;
  case 1:
    iVar1 = 0x38;
    break;
  case 2:
    return 0;
  default:
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      iVar1 = 0x3b;
    }
    else {
      state->handler = error;
      iVar1 = -1;
    }
    break;
  case 9:
    state->handler = error;
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int PTRCALL
prolog2(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    return XML_ROLE_COMMENT;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}